

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall ParamActive::registerTrial(ParamActive *this,Address *addr,int4 sz)

{
  pointer pPVar1;
  ParamTrial local_40;
  
  local_40.slot = this->slotbase;
  local_40.addr.base = addr->base;
  local_40.addr.offset = addr->offset;
  local_40.flags = 0;
  local_40.entry = (ParamEntry *)0x0;
  local_40.offset = -1;
  local_40.size = sz;
  std::vector<ParamTrial,_std::allocator<ParamTrial>_>::emplace_back<ParamTrial>
            (&this->trial,&local_40);
  if (addr->base->type != IPTR_SPACEBASE) {
    pPVar1 = (this->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    pPVar1->flags = pPVar1->flags | 0x20;
  }
  this->slotbase = this->slotbase + 1;
  return;
}

Assistant:

void ParamActive::registerTrial(const Address &addr,int4 sz)

{
  trial.push_back(ParamTrial(addr,sz,slotbase));
  // It would require too much work to calculate whether a specific data location is changed
  // by a subfunction, but a fairly strong assumption is that (unless it is explicitly saved) a
  // register may change and is thus unlikely to be used as a location for passing parameters.
  // However stack locations saving a parameter across a function call is a common construction
  // Since this all a heuristic for recovering parameters, we assume this rule is always true
  // to get an efficient test
  if (addr.getSpace()->getType() != IPTR_SPACEBASE)
    trial.back().markKilledByCall();
  slotbase += 1;
}